

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<int>::erase
          (RepeatedField<int> *this,const_iterator first,const_iterator last)

{
  const_iterator piVar1;
  const_iterator __result;
  iterator piVar2;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int in_stack_0000001c;
  RepeatedField<int> *in_stack_00000020;
  size_type first_offset;
  RepeatedField<int> *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  
  piVar1 = cbegin((RepeatedField<int> *)0x42907c);
  if (in_RSI != in_RDX) {
    __result = cend(in_stack_ffffffffffffffc0);
    begin((RepeatedField<int> *)0x4290bd);
    std::copy<int_const*,int*>(in_RDI,in_stack_ffffffffffffffc8,__result);
    cbegin((RepeatedField<int> *)0x4290e9);
    Truncate(in_stack_00000020,in_stack_0000001c);
  }
  piVar2 = begin((RepeatedField<int> *)0x42910e);
  return piVar2 + (int)(in_RSI - (long)piVar1 >> 2);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}